

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

void internal_dump_attr_list(FILE *out,attr_list list,int indent)

{
  int in_EDX;
  short *in_RSI;
  FILE *in_RDI;
  int i_1;
  int i;
  int in_stack_000000c4;
  attr_list in_stack_000000c8;
  FILE *in_stack_000000d0;
  int local_1c;
  int local_18;
  
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    fprintf(in_RDI,"    ");
  }
  if (in_RSI == (short *)0x0) {
    fprintf(in_RDI,"[NULL]\n");
  }
  else {
    fprintf(in_RDI,"[\n");
    if (*in_RSI == 0) {
      dump_attr_sublist(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4);
    }
    else {
      for (local_1c = 0; local_1c < *(int *)(in_RSI + 4); local_1c = local_1c + 1) {
        dump_attr_sublist(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4);
      }
    }
    for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
      fprintf(in_RDI,"    ");
    }
    fprintf(in_RDI,"]\n");
  }
  return;
}

Assistant:

static void
internal_dump_attr_list (FILE *out, attr_list list, int indent)
{
    int i = 0;
    for (i = 0; i< indent; i++) {
        fprintf(out, "    ");
    }
    if (list == NULL) {
        fprintf(out, "[NULL]\n");
        return;
    }
    fprintf(out, "[\n");
    if (!list->list_of_lists) {
        dump_attr_sublist(out, list, indent);
    } else {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            dump_attr_sublist(out, list->l.lists.lists[i], indent);
        }
    }
    for (i=0; i< indent; i++) {
        fprintf(out, "    ");
    }
    fprintf(out, "]\n");
}